

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-unix-test.c++
# Opt level: O0

void __thiscall kj::anon_unknown_0::TestCase153::run(TestCase153 *this)

{
  bool bVar1;
  Type *func;
  int local_1b8;
  bool local_1b1;
  int local_1b0;
  bool local_1aa;
  bool _kj_shouldLog_2;
  bool _kj_shouldLog_1;
  undefined1 *puStack_1a8;
  bool _kj_shouldLog;
  Maybe<kj::Exception> local_1a0;
  undefined1 local_30 [8];
  Arena arena;
  TestCase153 *this_local;
  
  (anonymous_namespace)::TestObject::count = 0;
  (anonymous_namespace)::TestObject::throwAt = 1;
  arena.currentChunk = (ChunkHeader *)this;
  Arena::Arena((Arena *)local_30,0x400);
  Arena::allocate<kj::(anonymous_namespace)::TestObject>((Arena *)local_30);
  puStack_1a8 = local_30;
  runCatchingExceptions<kj::(anonymous_namespace)::TestCase153::run()::__0>
            (&local_1a0,(kj *)&stack0xfffffffffffffe58,func);
  bVar1 = Maybe<kj::Exception>::operator!=(&local_1a0,(void *)0x0);
  Maybe<kj::Exception>::~Maybe(&local_1a0);
  if (!bVar1) {
    _kj_shouldLog_2 = _::Debug::shouldLog(ERROR);
    while (_kj_shouldLog_2 != false) {
      _::Debug::log<char_const(&)[97]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/arena-test.c++"
                 ,0xa1,ERROR,
                 "\"failed: expected \" \"::kj::runCatchingExceptions([&]() { arena.allocate<TestObject>(); }) != nullptr\""
                 ,(char (*) [97])
                  "failed: expected ::kj::runCatchingExceptions([&]() { arena.allocate<TestObject>(); }) != nullptr"
                );
      _kj_shouldLog_2 = false;
    }
  }
  if ((anonymous_namespace)::TestObject::count != 1) {
    local_1aa = _::Debug::shouldLog(ERROR);
    while (local_1aa != false) {
      local_1b0 = 1;
      _::Debug::log<char_const(&)[44],int,int&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/arena-test.c++"
                 ,0xa2,ERROR,
                 "\"failed: expected \" \"(1) == (TestObject::count)\", 1, TestObject::count",
                 (char (*) [44])"failed: expected (1) == (TestObject::count)",&local_1b0,
                 &(anonymous_namespace)::TestObject::count);
      local_1aa = false;
    }
  }
  Arena::~Arena((Arena *)local_30);
  if ((anonymous_namespace)::TestObject::count != 0) {
    local_1b1 = _::Debug::shouldLog(ERROR);
    while (local_1b1 != false) {
      local_1b8 = 0;
      _::Debug::log<char_const(&)[44],int,int&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/arena-test.c++"
                 ,0xa5,ERROR,
                 "\"failed: expected \" \"(0) == (TestObject::count)\", 0, TestObject::count",
                 (char (*) [44])"failed: expected (0) == (TestObject::count)",&local_1b8,
                 &(anonymous_namespace)::TestObject::count);
      local_1b1 = false;
    }
  }
  return;
}

Assistant:

TEST(AsyncUnixTest, SignalsMultiListen) {
  captureSignals();
  UnixEventPort port;
  EventLoop loop(port);
  WaitScope waitScope(loop);

  port.onSignal(SIGIO).then([](siginfo_t&&) {
    KJ_FAIL_EXPECT("Received wrong signal.");
  }).detach([](kj::Exception&& exception) {
    KJ_FAIL_EXPECT(exception);
  });

  kill(getpid(), SIGURG);

  siginfo_t info = port.onSignal(SIGURG).wait(waitScope);
  EXPECT_EQ(SIGURG, info.si_signo);
  EXPECT_SI_CODE(SI_USER, info.si_code);
}